

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong *puVar4;
  TestError *pTVar5;
  size_type *psVar6;
  long *plVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  long local_2f0;
  InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *local_2e8;
  ulong local_2e0;
  long *plStack_2d8;
  long lStack_2d0;
  long lStack_2c8;
  long lStack_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2b8;
  string array_initializers [4];
  string invalid_size_declarations [15];
  
  invalid_size_declarations[0]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0].field_2;
  local_2e8 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)invalid_size_declarations,"[2][2][2][]","");
  invalid_size_declarations[1]._M_dataplus._M_p = (pointer)&invalid_size_declarations[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 1),"[2][2][][2]","");
  invalid_size_declarations[2]._M_dataplus._M_p = (pointer)&invalid_size_declarations[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 2),"[2][][2][2]","");
  invalid_size_declarations[3]._M_dataplus._M_p = (pointer)&invalid_size_declarations[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 3),"[][2][2][2]","");
  invalid_size_declarations[4]._M_dataplus._M_p = (pointer)&invalid_size_declarations[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 4),"[2][2][][]","");
  invalid_size_declarations[5]._M_dataplus._M_p = (pointer)&invalid_size_declarations[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 5),"[2][][2][]","");
  invalid_size_declarations[6]._M_dataplus._M_p = (pointer)&invalid_size_declarations[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 6),"[][2][2][]","");
  invalid_size_declarations[7]._M_dataplus._M_p = (pointer)&invalid_size_declarations[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 7),"[2][][][2]","");
  invalid_size_declarations[8]._M_dataplus._M_p = (pointer)&invalid_size_declarations[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 8),"[][2][][2]","");
  invalid_size_declarations[9]._M_dataplus._M_p = (pointer)&invalid_size_declarations[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 9),"[][][2][2]","");
  invalid_size_declarations[10]._M_dataplus._M_p = (pointer)&invalid_size_declarations[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 10),"[2][][][]","");
  invalid_size_declarations[0xb]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xb].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xb),"[][2][][]","");
  invalid_size_declarations[0xc]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xc].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xc),"[][][2][]","");
  invalid_size_declarations[0xd]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xd].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xd),"[][][][2]","");
  invalid_size_declarations[0xe]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xe].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xe),"[][][][]","");
  array_initializers[0]._M_dataplus._M_p = (pointer)&array_initializers[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)array_initializers,
             "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),float[2](3.0, 4.0)),float[2][2](float[2](5.0, 6.0),float[2](7.0, 8.0))),float[2][2][2](float[2][2](float[2](1.1, 2.1),float[2](3.1, 4.1)),float[2][2](float[2](5.1, 6.1),float[2](7.1, 8.1))));\n"
             ,"");
  array_initializers[1]._M_dataplus._M_p = (pointer)&array_initializers[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 1),
             "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),int[2]( 3,  4)),int[2][2](int[2]( 5,  6),int[2]( 7,  8))),int[2][2][2](int[2][2](int[2](11, 12),int[2](13, 14)),int[2][2](int[2](15, 16),int[2](17, 18))));\n"
             ,"");
  array_initializers[2]._M_dataplus._M_p = (pointer)&array_initializers[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 2),
             "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),uint[2]( 3u,  4u)),uint[2][2](uint[2]( 5u,  6u),uint[2]( 7u,  8u))),uint[2][2][2](uint[2][2](uint[2](11u, 12u),uint[2](13u, 14u)),uint[2][2](uint[2](15u, 16u),uint[2](17u, 18u))));\n"
             ,"");
  array_initializers[3]._M_dataplus._M_p = (pointer)&array_initializers[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 3),
             "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),double[2](3.0, 4.0)),double[2][2](double[2](5.0, 6.0),double[2](7.0, 8.0))),double[2][2][2](double[2][2](double[2](1.1, 2.1),double[2](3.1, 4.1)),double[2][2](double[2](5.1, 6.1),double[2](7.1, 8.1))));\n"
             ,"");
  lVar8 = 0;
  do {
    lVar1 = 0x222cb38;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar1 = 0x222cb38;
      lVar2 = supported_variable_types_map._16_8_;
      do {
        if ((int)test_shader_compilation::var_types_set_gl[lVar8] <= *(int *)(lVar2 + 0x20)) {
          lVar1 = lVar2;
        }
        lVar2 = *(long *)(lVar2 + 0x10 +
                         (ulong)(*(int *)(lVar2 + 0x20) <
                                (int)test_shader_compilation::var_types_set_gl[lVar8]) * 8);
      } while (lVar2 != 0);
    }
    lVar2 = 0x222cb38;
    if ((lVar1 != 0x222cb38) &&
       (lVar2 = lVar1,
       (int)test_shader_compilation::var_types_set_gl[lVar8] < *(int *)(lVar1 + 0x20))) {
      lVar2 = 0x222cb38;
    }
    local_2f0 = lVar8;
    if (lVar2 == 0x222cb38) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c52);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar8 = 8;
    do {
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      shader_source._M_string_length = 0;
      shader_source.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)&shader_source,0,(char *)0x0,0x1b1929a);
      std::operator+(&local_310,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar2 + 0x28));
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_310,
                                  *(ulong *)((long)&array_initializers[3].field_2 + lVar8 + 8));
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_378.field_2._M_allocated_capacity = *psVar6;
        local_378.field_2._8_8_ = plVar3[3];
      }
      else {
        local_378.field_2._M_allocated_capacity = *psVar6;
        local_378._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_378._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_378);
      plVar7 = plVar3 + 2;
      if ((long *)*plVar3 == plVar7) {
        local_348 = *plVar7;
        lStack_340 = plVar3[3];
        local_358 = &local_348;
      }
      else {
        local_348 = *plVar7;
        local_358 = (long *)*plVar3;
      }
      local_350 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_358);
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
      if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1c49);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_2e0 = (ulong)tested_shader_type;
      puVar4 = &set_tesseation_abi_cxx11_;
      switch(local_2e0) {
      case 1:
        std::__cxx11::string::append((char *)&shader_source);
        break;
      case 3:
        puVar4 = &emit_quad_abi_cxx11_;
      case 4:
        std::__cxx11::string::_M_append((char *)&shader_source,*puVar4);
      }
      std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
      if (lVar8 == 0x68) {
        if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1c4d);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*(code *)(&DAT_01b0ea30 + *(int *)(&DAT_01b0ea30 + local_2e0 * 4)))
                  (&DAT_01b0ea30 + *(int *)(&DAT_01b0ea30 + local_2e0 * 4),empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_);
        return;
      }
      (*(local_2e8->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(local_2e8,(ulong)tested_shader_type,&shader_source);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        CONCAT71(shader_source.field_2._M_allocated_capacity._1_7_,
                                 shader_source.field_2._M_local_buf[0]) + 1);
      }
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x1e8);
    lVar8 = local_2f0 + 1;
    if (lVar8 == 4) {
      lVar8 = 0x222cb38;
      if (supported_variable_types_map._16_8_ != 0) {
        lVar8 = 0x222cb38;
        lVar1 = supported_variable_types_map._16_8_;
        do {
          if ((int)TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES <
              *(int *)(lVar1 + 0x20)) {
            lVar8 = lVar1;
          }
          lVar1 = *(long *)(lVar1 + 0x10 +
                           (ulong)(*(int *)(lVar1 + 0x20) <
                                  (int)TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT) * 8);
        } while (lVar1 != 0);
      }
      lVar1 = 0x222cb38;
      if ((lVar8 != 0x222cb38) &&
         (lVar1 = lVar8, (int)TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT < *(int *)(lVar8 + 0x20))) {
        lVar1 = 0x222cb38;
      }
      if (lVar1 != 0x222cb38) {
        local_2f0 = 0;
        shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
        shader_source._M_string_length = 0;
        shader_source.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_replace((ulong)&shader_source,0,(char *)0x0,0x1b1929a);
        std::operator+(&bStack_2b8,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar1 + 0x28));
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&bStack_2b8,
                                    (ulong)invalid_size_declarations[0]._M_dataplus._M_p);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        psVar6 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_310.field_2._M_allocated_capacity = *psVar6;
          local_310.field_2._8_8_ = plVar3[3];
        }
        else {
          local_310.field_2._M_allocated_capacity = *psVar6;
          local_310._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_310._M_string_length = plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        psVar6 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_378.field_2._M_allocated_capacity = *psVar6;
          local_378.field_2._8_8_ = plVar3[3];
        }
        else {
          local_378.field_2._M_allocated_capacity = *psVar6;
          local_378._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_378._M_string_length = plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_378,(ulong)array_initializers[0]._M_dataplus._M_p
                                   );
        plVar7 = plVar3 + 2;
        if ((long *)*plVar3 == plVar7) {
          local_348 = *plVar7;
          lStack_340 = plVar3[3];
          local_358 = &local_348;
        }
        else {
          local_348 = *plVar7;
          local_358 = (long *)*plVar3;
        }
        local_350 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_358);
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bStack_2b8._M_dataplus._M_p != &bStack_2b8.field_2) {
          operator_delete(bStack_2b8._M_dataplus._M_p,bStack_2b8.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar1 + 0x28),invalid_size_declarations);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_378);
        plVar7 = plVar3 + 2;
        if ((long *)*plVar3 == plVar7) {
          local_348 = *plVar7;
          lStack_340 = plVar3[3];
          local_358 = &local_348;
        }
        else {
          local_348 = *plVar7;
          local_358 = (long *)*plVar3;
        }
        local_350 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_358,(ulong)array_initializers[0]._M_dataplus._M_p
                                   );
        plVar7 = plVar3 + 2;
        if ((long *)*plVar3 == plVar7) {
          lStack_2c8 = *plVar7;
          lStack_2c0 = plVar3[3];
          plStack_2d8 = &lStack_2c8;
        }
        else {
          lStack_2c8 = *plVar7;
          plStack_2d8 = (long *)*plVar3;
        }
        lStack_2d0 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (plStack_2d8 != &lStack_2c8) {
          operator_delete(plStack_2d8,lStack_2c8 + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&shader_source);
        std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
        if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1c72);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*(code *)(&DAT_01b0ea48 + *(int *)(&DAT_01b0ea48 + local_2e0 * 4)))();
        return;
      }
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c7a);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  } while( true );
}

Assistant:

void InteractionUniformBuffers3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string invalid_size_declarations[] = { "[2][2][2][]", "[2][2][][2]", "[2][][2][2]", "[][2][2][2]",
													  "[2][2][][]",  "[2][][2][]",  "[][2][2][]",  "[2][][][2]",
													  "[][2][][2]",  "[][][2][2]",  "[2][][][]",   "[][2][][]",
													  "[][][2][]",   "[][][][2]",   "[][][][]" };

	const std::string array_initializers[] = { "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),"
											   "float[2](3.0, 4.0)),"
											   "float[2][2](float[2](5.0, 6.0),"
											   "float[2](7.0, 8.0))),"
											   "float[2][2][2](float[2][2](float[2](1.1, 2.1),"
											   "float[2](3.1, 4.1)),"
											   "float[2][2](float[2](5.1, 6.1),"
											   "float[2](7.1, 8.1))));\n",

											   "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),"
											   "int[2]( 3,  4)),"
											   "int[2][2](int[2]( 5,  6),"
											   "int[2]( 7,  8))),"
											   "int[2][2][2](int[2][2](int[2](11, 12),"
											   "int[2](13, 14)),"
											   "int[2][2](int[2](15, 16),"
											   "int[2](17, 18))));\n",

											   "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),"
											   "uint[2]( 3u,  4u)),"
											   "uint[2][2](uint[2]( 5u,  6u),"
											   "uint[2]( 7u,  8u))),"
											   "uint[2][2][2](uint[2][2](uint[2](11u, 12u),"
											   "uint[2](13u, 14u)),"
											   "uint[2][2](uint[2](15u, 16u),"
											   "uint[2](17u, 18u))));\n",

											   "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),"
											   "double[2](3.0, 4.0)),"
											   "double[2][2](double[2](5.0, 6.0),"
											   "double[2](7.0, 8.0))),"
											   "double[2][2][2](double[2][2](double[2](1.1, 2.1),"
											   "double[2](3.1, 4.1)),"
											   "double[2][2](double[2](5.1, 6.1),"
											   "double[2](7.1, 8.1))));\n" };
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float/ int/ uint types.
	 * Case: without initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] + " my_variable;\n";
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION && invalid_size_declarations_index == 3,
									tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	/* Iterate through float/ int/ uint types.
	 * Case: with initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] +
								 " my_variable = " + array_initializers[var_type_index];

				var_iterator->second.type + invalid_size_declarations[invalid_size_declarations_index] +
					" my_variable = " + array_initializers[var_type_index];
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}